

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O3

Id __thiscall
spv::Builder::createCompositeConstruct
          (Builder *this,Id typeId,vector<unsigned_int,_std::allocator<unsigned_int>_> *constituents
          )

{
  Id *pIVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  Id IVar5;
  tuple<spv::Instruction_*,_std::default_delete<spv::Instruction>_> this_00;
  size_t __n;
  Op OVar6;
  Id *pIVar7;
  long lVar8;
  pointer __s2;
  Id *pIVar9;
  long lVar10;
  pointer puVar11;
  size_type __n_00;
  Capability local_3c;
  __uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_> local_38;
  
  OVar6 = (this->module).idToInstruction.
          super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
          super__Vector_impl_data._M_start[typeId]->opCode;
  if ((int)OVar6 < 0x1168) {
    if ((OVar6 != OpTypeArray) && (OVar6 != OpTypeStruct)) {
LAB_003d969e:
      uVar3 = getNumTypeConstituents(this,typeId);
      if (((uVar3 < 2) ||
          (uVar3 = getNumTypeConstituents(this,typeId),
          (long)(constituents->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(constituents->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                _M_impl.super__Vector_impl_data._M_start >> 2 != (ulong)uVar3)) &&
         (((this->module).idToInstruction.
           super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
           super__Vector_impl_data._M_start[typeId]->opCode != OpTypeCooperativeVectorNV ||
          ((long)(constituents->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(constituents->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                 _M_impl.super__Vector_impl_data._M_start != 4)))) {
        __assert_fail("isAggregateType(typeId) || (getNumTypeConstituents(typeId) > 1 && getNumTypeConstituents(typeId) == constituents.size()) || (isCooperativeVectorType(typeId) && constituents.size() == 1)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                      ,0xd89,
                      "Id spv::Builder::createCompositeConstruct(Id, const std::vector<Id> &)");
      }
    }
  }
  else if ((OVar6 != OpTypeCooperativeMatrixKHR) && (OVar6 != OpTypeCooperativeMatrixNV))
  goto LAB_003d969e;
  if (this->generatingOpCodeForSpecConst != true) {
    __s2 = (constituents->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
    puVar11 = (constituents->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
              _M_impl.super__Vector_impl_data._M_finish;
    lVar10 = (long)puVar11 - (long)__s2 >> 2;
    if ((this->useReplicatedComposites == false) &&
       ((this->module).idToInstruction.
        super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
        super__Vector_impl_data._M_start[typeId]->opCode != OpTypeCooperativeVectorNV)) {
      OVar6 = OpCompositeConstruct;
    }
    else {
      OVar6 = OpCompositeConstruct;
      if (puVar11 == __s2) {
        lVar10 = 0;
        __s2 = puVar11;
      }
      else {
        __n = (long)puVar11 - (long)(__s2 + 1);
        if ((__n == 0) || (iVar4 = bcmp(__s2 + 1,__s2,__n), iVar4 == 0)) {
          local_3c = CapabilityReplicatedCompositesEXT;
          std::
          _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
          ::_M_insert_unique<spv::Capability_const&>
                    ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                      *)&this->capabilities,&local_3c);
          addExtension(this,"SPV_EXT_replicated_composites");
          puVar11 = (constituents->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_finish;
          lVar10 = 1;
          OVar6 = OpCompositeConstructReplicateEXT;
          __s2 = (constituents->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        }
      }
    }
    this_00.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
    super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
         operator_new(0x60);
    IVar5 = this->uniqueId + 1;
    this->uniqueId = IVar5;
    *(undefined ***)
     this_00.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
     super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl = &PTR__Instruction_00927e68;
    *(Id *)((long)this_00.
                  super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                  .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 8) = IVar5;
    *(Id *)((long)this_00.
                  super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                  .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0xc) = typeId;
    *(Op *)((long)this_00.
                  super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                  .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x10) = OVar6;
    (((_Bit_iterator *)
     ((long)this_00.
            super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
            super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x40))->
    super__Bit_iterator_base)._M_p = (_Bit_type *)0x0;
    *(uint *)((long)this_00.
                    super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                    .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x48) = 0;
    (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
     ((long)this_00.
            super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
            super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x18))->
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.super__Vector_impl_data
    ._M_start = (pointer)0x0;
    *(pointer *)
     ((long)this_00.
            super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
            super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x20) = (pointer)0x0;
    *(pointer *)
     ((long)this_00.
            super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
            super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x28) = (pointer)0x0;
    (((vector<bool,_std::allocator<bool>_> *)
     ((long)this_00.
            super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
            super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x30))->
    super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    *(uint *)((long)this_00.
                    super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                    .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x38) = 0;
    *(_Bit_pointer *)
     ((long)this_00.
            super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
            super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x50) =
         (_Bit_pointer)0x0;
    *(Block **)
     ((long)this_00.
            super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
            super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x58) = (Block *)0x0;
    __n_00 = (long)puVar11 - (long)__s2 >> 2;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               ((long)this_00.
                      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                      .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x18),__n_00)
    ;
    std::vector<bool,_std::allocator<bool>_>::reserve
              ((vector<bool,_std::allocator<bool>_> *)
               ((long)this_00.
                      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                      .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x30),__n_00)
    ;
    if (lVar10 != 0) {
      lVar8 = 0;
      do {
        Instruction::addIdOperand
                  ((Instruction *)
                   this_00.
                   super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                   .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl,
                   (constituents->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                   _M_impl.super__Vector_impl_data._M_start[lVar8]);
        lVar8 = lVar8 + 1;
      } while (lVar10 != lVar8);
    }
    local_38._M_t.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
    .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl =
         (tuple<spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
         (tuple<spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
         this_00.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
         super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl;
    addInstruction(this,(unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                        &local_38);
    if ((_Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
        local_38._M_t.
        super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
        super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl != (Instruction *)0x0) {
      (**(code **)(*(long *)local_38._M_t.
                            super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                            .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 8))();
    }
    return *(Id *)((long)this_00.
                         super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                         .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 8);
  }
  pIVar7 = (constituents->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pIVar1 = (constituents->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  lVar10 = (long)pIVar1 - (long)pIVar7;
  if (0 < lVar10 >> 4) {
    lVar8 = (lVar10 >> 4) + 1;
    pIVar7 = pIVar7 + 2;
    do {
      pIVar9 = pIVar7;
      bVar2 = isSpecConstant(this,pIVar9[-2]);
      if (bVar2) {
        pIVar9 = pIVar9 + -2;
        goto LAB_003d99b6;
      }
      bVar2 = isSpecConstant(this,pIVar9[-1]);
      if (bVar2) {
        pIVar9 = pIVar9 + -1;
        goto LAB_003d99b6;
      }
      bVar2 = isSpecConstant(this,*pIVar9);
      if (bVar2) goto LAB_003d99b6;
      bVar2 = isSpecConstant(this,pIVar9[1]);
      if (bVar2) {
        pIVar9 = pIVar9 + 1;
        goto LAB_003d99b6;
      }
      lVar8 = lVar8 + -1;
      lVar10 = lVar10 + -0x10;
      pIVar7 = pIVar9 + 4;
    } while (1 < lVar8);
    pIVar7 = pIVar9 + 2;
  }
  lVar10 = lVar10 >> 2;
  if (lVar10 != 1) {
    if (lVar10 != 2) {
      pIVar9 = pIVar1;
      if ((lVar10 != 3) || (bVar2 = isSpecConstant(this,*pIVar7), pIVar9 = pIVar7, bVar2))
      goto LAB_003d99b6;
      pIVar7 = pIVar7 + 1;
    }
    bVar2 = isSpecConstant(this,*pIVar7);
    pIVar9 = pIVar7;
    if (bVar2) goto LAB_003d99b6;
    pIVar7 = pIVar7 + 1;
  }
  bVar2 = isSpecConstant(this,*pIVar7);
  pIVar9 = pIVar7;
  if (!bVar2) {
    pIVar9 = pIVar1;
  }
LAB_003d99b6:
  IVar5 = makeCompositeConstant(this,typeId,constituents,pIVar9 != pIVar1);
  return IVar5;
}

Assistant:

Id Builder::createCompositeConstruct(Id typeId, const std::vector<Id>& constituents)
{
    assert(isAggregateType(typeId) || (getNumTypeConstituents(typeId) > 1 &&
           getNumTypeConstituents(typeId) == constituents.size()) ||
           (isCooperativeVectorType(typeId) && constituents.size() == 1));

    if (generatingOpCodeForSpecConst) {
        // Sometime, even in spec-constant-op mode, the constant composite to be
        // constructed may not be a specialization constant.
        // e.g.:
        //  const mat2 m2 = mat2(a_spec_const, a_front_end_const, another_front_end_const, third_front_end_const);
        // The first column vector should be a spec constant one, as a_spec_const is a spec constant.
        // The second column vector should NOT be spec constant, as it does not contain any spec constants.
        // To handle such cases, we check the constituents of the constant vector to determine whether this
        // vector should be created as a spec constant.
        return makeCompositeConstant(typeId, constituents,
                                     std::any_of(constituents.begin(), constituents.end(),
                                                 [&](spv::Id id) { return isSpecConstant(id); }));
    }

    bool replicate = false;
    size_t numConstituents = constituents.size();

    if (useReplicatedComposites || isCooperativeVectorType(typeId)) {
        replicate = numConstituents > 0 &&
            std::equal(constituents.begin() + 1, constituents.end(), constituents.begin());
    }

    if (replicate) {
        numConstituents = 1;
        addCapability(spv::CapabilityReplicatedCompositesEXT);
        addExtension(spv::E_SPV_EXT_replicated_composites);
    }

    Op opcode = replicate ? OpCompositeConstructReplicateEXT : OpCompositeConstruct;

    Instruction* op = new Instruction(getUniqueId(), typeId, opcode);
    op->reserveOperands(constituents.size());
    for (size_t c = 0; c < numConstituents; ++c)
        op->addIdOperand(constituents[c]);
    addInstruction(std::unique_ptr<Instruction>(op));

    return op->getResultId();
}